

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  undefined1 auVar1 [12];
  tdefl_compressor *__ptr;
  int iVar2;
  int iVar3;
  int iVar4;
  tdefl_status tVar5;
  mz_bool mVar6;
  tdefl_compressor *ptVar7;
  mz_uint8 *pmVar8;
  ulong uVar9;
  size_t sVar10;
  mz_ulong mVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int local_bc;
  tdefl_compressor *local_b8;
  int local_b0;
  int local_ac;
  tdefl_output_buffer out_buf;
  undefined8 local_68;
  undefined1 uStack_60;
  undefined1 auStack_5f [7];
  undefined1 uStack_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined2 uStack_54;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  uint uStack_4f;
  undefined1 uStack_4b;
  undefined2 uStack_4a;
  undefined1 uStack_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined4 local_43;
  
  ptVar7 = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (ptVar7 != (tdefl_compressor *)0x0) {
    iVar2 = num_chans * w;
    out_buf.m_pBuf = (mz_uint8 *)0x0;
    out_buf.m_size = SUB168(ZEXT816(0) << 0x40,0);
    out_buf.m_capacity = SUB168(ZEXT816(0) << 0x40,8);
    out_buf.m_expandable = 1;
    iVar3 = (iVar2 + 1) * h;
    iVar13 = 0x40;
    if (0x40 < iVar3) {
      iVar13 = iVar3;
    }
    auVar1 = out_buf._16_12_;
    out_buf._0_16_ = ZEXT416(iVar13 + 0x39U) << 0x40;
    out_buf.m_pBuf = (mz_uint8 *)auVar1._0_8_;
    out_buf.m_expandable = auVar1._8_4_;
    out_buf._28_4_ = 0;
    local_ac = w;
    pmVar8 = (mz_uint8 *)malloc((ulong)(iVar13 + 0x39U));
    out_buf.m_pBuf = pmVar8;
    if (pmVar8 != (mz_uint8 *)0x0) {
      local_b8 = ptVar7;
      local_b0 = num_chans;
      local_bc = 0x29;
      while (iVar13 = local_bc + -1, local_bc != 0) {
        (anonymous_namespace)::miniz::tdefl_output_buffer_putter(&local_bc,1,&out_buf);
        local_bc = iVar13;
      }
      uVar9 = 10;
      if (level < 10) {
        uVar9 = (ulong)level;
      }
      tdefl_init(local_b8,(anonymous_namespace)::miniz::tdefl_output_buffer_putter,&out_buf,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar9] | 0x1000)
      ;
      ptVar7 = local_b8;
      iVar3 = 0;
      iVar13 = 0;
      if (0 < h) {
        iVar13 = h;
      }
      iVar14 = h;
      for (; __ptr = local_b8, iVar14 = iVar14 + -1, iVar13 != iVar3; iVar3 = iVar3 + 1) {
        tdefl_compress_buffer(ptVar7,&local_bc,1,TDEFL_NO_FLUSH);
        iVar4 = iVar14;
        if (flip == 0) {
          iVar4 = iVar3;
        }
        tdefl_compress_buffer
                  (ptVar7,(void *)((long)(iVar4 * iVar2) + (long)pImage),(long)iVar2,TDEFL_NO_FLUSH)
        ;
      }
      tVar5 = tdefl_compress_buffer(local_b8,(void *)0x0,0,TDEFL_FINISH);
      if (tVar5 == TDEFL_STATUS_DONE) {
        sVar10 = out_buf.m_size - 0x29;
        *pLen_out = sVar10;
        local_68 = 0xa1a0a0d474e5089;
        uStack_60 = 0;
        auStack_5f = (undefined1  [7])0x524448490d0000;
        uStack_58 = 0;
        uStack_57 = 0;
        uStack_56 = (undefined1)((uint)local_ac >> 8);
        uStack_55 = (undefined1)local_ac;
        uStack_54 = 0;
        uStack_52 = (undefined1)((uint)h >> 8);
        uStack_51 = (undefined1)h;
        uStack_50 = 8;
        uStack_4f = (uint)""[local_b0];
        uStack_4b = 0;
        uStack_4a = 0;
        uStack_48 = 0;
        local_47 = (undefined1)(sVar10 >> 0x18);
        local_46 = (undefined1)(sVar10 >> 0x10);
        local_45 = (undefined1)(sVar10 >> 8);
        local_44 = (undefined1)sVar10;
        local_43 = 0x54414449;
        mVar11 = mz_crc32(0,auStack_5f + 3,0x11);
        for (lVar12 = 0x1d; lVar12 != 0x21; lVar12 = lVar12 + 1) {
          *(char *)((long)&local_68 + lVar12) = (char)(mVar11 >> 0x18);
          mVar11 = (mz_ulong)(uint)((int)mVar11 << 8);
        }
        *(ulong *)(out_buf.m_pBuf + 9) = CONCAT17(uStack_58,auStack_5f);
        *(ulong *)(out_buf.m_pBuf + 0x11) =
             CONCAT17(uStack_50,
                      CONCAT16(uStack_51,
                               CONCAT15(uStack_52,
                                        CONCAT23(uStack_54,
                                                 CONCAT12(uStack_55,CONCAT11(uStack_56,uStack_57))))
                              ));
        *(ulong *)(out_buf.m_pBuf + 0x19) =
             CONCAT17(uStack_48,CONCAT25(uStack_4a,CONCAT14(uStack_4b,uStack_4f)));
        *(ulong *)(out_buf.m_pBuf + 0x21) =
             CONCAT44(local_43,CONCAT13(local_44,CONCAT12(local_45,CONCAT11(local_46,local_47))));
        *(undefined8 *)out_buf.m_pBuf = local_68;
        *(ulong *)(out_buf.m_pBuf + 8) = CONCAT71(auStack_5f,uStack_60);
        *(ulong *)(out_buf.m_pBuf + 0x10) =
             CONCAT17(uStack_51,
                      CONCAT16(uStack_52,
                               CONCAT24(uStack_54,
                                        CONCAT13(uStack_55,
                                                 CONCAT12(uStack_56,CONCAT11(uStack_57,uStack_58))))
                              ));
        *(ulong *)(out_buf.m_pBuf + 0x18) =
             CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT41(uStack_4f,uStack_50)));
        mVar6 = (anonymous_namespace)::miniz::tdefl_output_buffer_putter("",0x10,&out_buf);
        if (mVar6 != 0) {
          mVar11 = mz_crc32(0,out_buf.m_pBuf + 0x25,*pLen_out + 4);
          for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
            out_buf.m_pBuf[lVar12 + -0x10 + out_buf.m_size] = (mz_uint8)(mVar11 >> 0x18);
            mVar11 = (mz_ulong)(uint)((int)mVar11 << 8);
          }
          *pLen_out = *pLen_out + 0x39;
          free(__ptr);
          return out_buf.m_pBuf;
        }
        *pLen_out = 0;
      }
      free(__ptr);
      ptVar7 = (tdefl_compressor *)out_buf.m_pBuf;
    }
    free(ptVar7);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w,
                                                 int h, int num_chans,
                                                 size_t *pLen_out,
                                                 mz_uint level, mz_bool flip) {
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was
  // defined.
  static const mz_uint s_tdefl_png_num_probes[11] = {
      0, 1, 6, 32, 16, 32, 128, 256, 512, 768, 1500};
  tdefl_compressor *pComp =
      (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8 *)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  // write dummy header
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf,
             s_tdefl_png_num_probes[MZ_MIN(10, level)] |
                 TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp,
                          (mz_uint8 *)pImage + (flip ? (h - 1 - y) : y) * bpl,
                          bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) !=
      TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  // write real header
  *pLen_out = out_buf.m_size - 41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41] = {
        0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00, 0x00, 0x00, 0x0d,
        0x49, 0x48, 0x44, 0x52, 0, 0, (mz_uint8)(w >> 8), (mz_uint8)w, 0, 0,
        (mz_uint8)(h >> 8), (mz_uint8)h, 8, chans[num_chans], 0, 0, 0, 0, 0, 0,
        0, (mz_uint8)(*pLen_out >> 24), (mz_uint8)(*pLen_out >> 16),
        (mz_uint8)(*pLen_out >> 8), (mz_uint8)*pLen_out, 0x49, 0x44, 0x41,
        0x54};
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8 *)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter(
          "\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4,
                          *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}